

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

bool __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::matches
          (call_matcher<void_(),_std::tuple<>_> *this,call_params_type_t<void_()> *params)

{
  list_elem<trompeloeil::condition_base<void_()>_> *plVar1;
  bool bVar2;
  int iVar3;
  
  plVar1 = (this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>.next;
  while ((bVar2 = plVar1 == &(this->conditions).
                             super_list_elem<trompeloeil::condition_base<void_()>_>, !bVar2 &&
         (iVar3 = (*plVar1->_vptr_list_elem[2])(plVar1,params), (char)iVar3 != '\0'))) {
    plVar1 = plVar1->next;
  }
  return bVar2;
}

Assistant:

bool
    matches(
      call_params_type_t<Sig> const& params)
    const
    override
    {
      return match_parameters(val, params) && match_conditions(params);
    }